

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

bool __thiscall ipx::Iterate::term_crit_reached(Iterate *this)

{
  double dVar1;
  bool bVar2;
  double dres;
  double pres;
  double local_28;
  double local_20;
  
  bVar2 = feasible(this);
  if ((bVar2) && (bVar2 = optimal(this), bVar2)) {
    dVar1 = this->start_crossover_tol_;
    if (dVar1 <= 0.0) {
      return true;
    }
    ResidualsFromDropping(this,&local_20,&local_28);
    if ((local_20 <= (this->model_->norm_bounds_ + 1.0) * dVar1) &&
       (local_28 <= dVar1 * (this->model_->norm_c_ + 1.0))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Iterate::term_crit_reached() const {
    if (feasible() && optimal()) {
        if (start_crossover_tol_ <= 0.0)
            return true;
        double pres, dres;
        ResidualsFromDropping(&pres, &dres);
        if (pres <= start_crossover_tol_ * (1.0+model_.norm_bounds()) &&
            dres <= start_crossover_tol_ * (1.0+model_.norm_c()))
            return true;
    }
    return false;
}